

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O1

boolean encode_mcu(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  jpeg_component_info *pjVar5;
  bool bVar6;
  short sVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  _func_void_j_compress_ptr *p_Var15;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var16;
  undefined4 uVar17;
  uint uVar18;
  int iVar19;
  int *piVar20;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar2[4].start_pass == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      *(uint *)&pjVar2[4].start_pass = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(int *)&pjVar2[4].start_pass = *(int *)&pjVar2[4].start_pass + -1;
  }
  if (0 < cinfo->blocks_in_MCU) {
    piVar3 = cinfo->natural_order;
    lVar8 = 0;
    do {
      paJVar4 = MCU_data[lVar8];
      lVar13 = (long)cinfo->MCU_membership[lVar8];
      pjVar5 = cinfo->cur_comp_info[lVar13];
      iVar1 = pjVar5->dc_tbl_no;
      p_Var16 = (&pjVar2[4].encode_mcu)[iVar1] + *(int *)((long)&pjVar2[3].encode_mcu + lVar13 * 4);
      iVar10 = (int)(*paJVar4)[0] - *(int *)((long)&pjVar2[2].finish_pass + lVar13 * 4);
      if (iVar10 == 0) {
        arith_encode(cinfo,(uchar *)p_Var16,0);
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar13 * 4) = 0;
      }
      else {
        *(int *)((long)&pjVar2[2].finish_pass + lVar13 * 4) = (int)(*paJVar4)[0];
        arith_encode(cinfo,(uchar *)p_Var16,1);
        uVar9 = 0;
        bVar6 = iVar10 < 1;
        if (bVar6) {
          iVar10 = -iVar10;
          uVar17 = 8;
          lVar14 = 3;
        }
        else {
          uVar17 = 4;
          lVar14 = 2;
        }
        arith_encode(cinfo,(uchar *)(p_Var16 + 1),(uint)bVar6);
        p_Var16 = p_Var16 + lVar14;
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar13 * 4) = uVar17;
        uVar11 = iVar10 - 1;
        if (uVar11 != 0) {
          uVar9 = 1;
          arith_encode(cinfo,(uchar *)p_Var16,1);
          p_Var16 = (&pjVar2[4].encode_mcu)[iVar1] + 0x14;
          if (uVar11 != 1) {
            uVar9 = 1;
            uVar18 = uVar11;
            do {
              arith_encode(cinfo,(uchar *)p_Var16,1);
              uVar9 = uVar9 * 2;
              p_Var16 = p_Var16 + 1;
              bVar6 = 3 < uVar18;
              uVar18 = uVar18 >> 1;
            } while (bVar6);
          }
        }
        iVar10 = 0;
        arith_encode(cinfo,(uchar *)p_Var16,0);
        if ((int)uVar9 < (int)((ulong)(1L << (cinfo->arith_dc_L[iVar1] & 0x3f)) >> 1)) {
LAB_001d1aba:
          *(int *)((long)&pjVar2[3].encode_mcu + lVar13 * 4) = iVar10;
        }
        else if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar1] & 0x3f)) >> 1) < (int)uVar9) {
          iVar10 = *(int *)((long)&pjVar2[3].encode_mcu + lVar13 * 4) + 8;
          goto LAB_001d1aba;
        }
        if (1 < uVar9) {
          do {
            uVar9 = (int)uVar9 >> 1;
            arith_encode(cinfo,(uchar *)(p_Var16 + 0xe),(uint)((uVar9 & uVar11) != 0));
          } while (1 < uVar9);
        }
      }
      lVar13 = (long)cinfo->lim_Se;
      if (lVar13 != 0) {
        iVar1 = pjVar5->ac_tbl_no;
        do {
          if ((*paJVar4)[piVar3[lVar13]] != 0) goto LAB_001d1b21;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
        lVar13 = 0;
LAB_001d1b21:
        iVar10 = 0;
        if (0 < (int)lVar13) {
          do {
            p_Var15 = (&pjVar2[9].finish_pass)[iVar1] + iVar10 * 3;
            arith_encode(cinfo,(uchar *)p_Var15,0);
            sVar7 = (*paJVar4)[piVar3[(long)iVar10 + 1]];
            iVar19 = iVar10 + 1;
            iVar12 = iVar10;
            if (sVar7 == 0) {
              piVar20 = piVar3 + (long)(iVar10 + 1) + 1;
              do {
                iVar19 = iVar10;
                arith_encode(cinfo,(uchar *)(p_Var15 + 1),0);
                p_Var15 = p_Var15 + 3;
                sVar7 = (*paJVar4)[*piVar20];
                iVar10 = iVar19 + 1;
                piVar20 = piVar20 + 1;
              } while (sVar7 == 0);
              iVar19 = iVar19 + 2;
              iVar12 = iVar10;
            }
            iVar10 = iVar19;
            iVar19 = (int)sVar7;
            arith_encode(cinfo,(uchar *)(p_Var15 + 1),1);
            if (sVar7 < 1) {
              iVar19 = -iVar19;
            }
            arith_encode(cinfo,(uchar *)(pjVar2 + 0xf),(uint)(sVar7 < 1));
            p_Var15 = p_Var15 + 2;
            uVar9 = iVar19 - 1;
            if (uVar9 == 0) {
              uVar11 = 0;
            }
            else {
              uVar11 = 1;
              arith_encode(cinfo,(uchar *)p_Var15,1);
              if (uVar9 != 1) {
                arith_encode(cinfo,(uchar *)p_Var15,1);
                lVar14 = 0xd9;
                if (iVar12 < (int)(uint)cinfo->arith_ac_K[iVar1]) {
                  lVar14 = 0xbd;
                }
                p_Var15 = (&pjVar2[9].finish_pass)[iVar1] + lVar14;
                uVar11 = 2;
                uVar18 = uVar9;
                while (uVar18 = (int)uVar18 >> 1, 1 < uVar18) {
                  arith_encode(cinfo,(uchar *)p_Var15,1);
                  uVar11 = uVar11 * 2;
                  p_Var15 = p_Var15 + 1;
                }
              }
            }
            arith_encode(cinfo,(uchar *)p_Var15,0);
            if (1 < uVar11) {
              do {
                uVar11 = (int)uVar11 >> 1;
                arith_encode(cinfo,(uchar *)(p_Var15 + 0xe),(uint)((uVar11 & uVar9) != 0));
              } while (1 < uVar11);
            }
          } while (iVar10 < (int)lVar13);
        }
        if (iVar10 < cinfo->lim_Se) {
          arith_encode(cinfo,(uchar *)((&pjVar2[9].finish_pass)[iVar1] + iVar10 * 3),1);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, k, ke;
  int v, v2, m;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = (*block)[0] - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;	/* zero diff category */
    } else {
      entropy->last_dc_val[ci] = (*block)[0];
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
	arith_encode(cinfo, st + 1, 0);	/* Table F.4: SS = S0 + 1 */
	st += 2;			/* Table F.4: SP = S0 + 2 */
	entropy->dc_context[ci] = 4;	/* small positive diff category */
      } else {
	v = -v;
	arith_encode(cinfo, st + 1, 1);	/* Table F.4: SS = S0 + 1 */
	st += 3;			/* Table F.4: SN = S0 + 3 */
	entropy->dc_context[ci] = 8;	/* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
	arith_encode(cinfo, st, 1);
	m = 1;
	v2 = v;
	st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
	while (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st += 1;
	}
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;	/* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] += 8;	/* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }

    /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

    if ((ke = cinfo->lim_Se) == 0) continue;
    tbl = compptr->ac_tbl_no;

    /* Establish EOB (end-of-block) index */
    do {
      if ((*block)[natural_order[ke]]) break;
    } while (--ke);

    /* Figure F.5: Encode_AC_Coefficients */
    for (k = 0; k < ke;) {
      st = entropy->ac_stats[tbl] + 3 * k;
      arith_encode(cinfo, st, 0);	/* EOB decision */
      while ((v = (*block)[natural_order[++k]]) == 0) {
	arith_encode(cinfo, st + 1, 0);
	st += 3;
      }
      arith_encode(cinfo, st + 1, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
	arith_encode(cinfo, entropy->fixed_bin, 0);
      } else {
	v = -v;
	arith_encode(cinfo, entropy->fixed_bin, 1);
      }
      st += 2;
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
	arith_encode(cinfo, st, 1);
	m = 1;
	v2 = v;
	if (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (v2 >>= 1) {
	    arith_encode(cinfo, st, 1);
	    m <<= 1;
	    st += 1;
	  }
	}
      }
      arith_encode(cinfo, st, 0);
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
    /* Encode EOB decision only if k < cinfo->lim_Se */
    if (k < cinfo->lim_Se) {
      st = entropy->ac_stats[tbl] + 3 * k;
      arith_encode(cinfo, st, 1);
    }
  }

  return TRUE;
}